

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeRows(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,int *nums,int n,int *perm)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  DataArray<int> p;
  int *local_30;
  undefined8 local_28;
  
  auVar4 = _DAT_00601040;
  auVar3 = _DAT_00601030;
  auVar2 = _DAT_00601020;
  if (perm == (int *)0x0) {
    iVar1 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
    local_30 = (int *)0x0;
    local_28 = 0x3ff3333333333333;
    iVar5 = 0;
    if (0 < iVar1) {
      iVar5 = iVar1;
    }
    iVar10 = 1;
    if (0 < iVar1) {
      iVar10 = iVar5;
    }
    spx_alloc<int*>(&local_30,iVar10);
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x13])(this,nums,(ulong)(uint)n,local_30);
    if (local_30 != (int *)0x0) {
      free(local_30);
    }
    return;
  }
  iVar1 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  lVar6 = (long)iVar1;
  if (0 < lVar6) {
    lVar7 = lVar6 + -1;
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar9 = auVar9 ^ _DAT_00601040;
    lVar8 = 0;
    do {
      auVar11._8_4_ = (int)lVar8;
      auVar11._0_8_ = lVar8;
      auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar12 = (auVar11 | auVar3) ^ auVar4;
      iVar10 = auVar9._4_4_;
      iVar5 = (int)lVar7;
      if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ || iVar10 < auVar12._4_4_
                  ) & 1)) {
        perm[lVar6 + lVar7 + -1] = iVar1 + -1 + iVar5;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        perm[lVar6 + lVar7 + -2] = iVar1 + -2 + iVar5;
      }
      auVar11 = (auVar11 | auVar2) ^ auVar4;
      iVar13 = auVar11._4_4_;
      if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
        perm[lVar6 + lVar7 + -3] = iVar1 + -3 + iVar5;
        perm[lVar6 + lVar7 + -4] = iVar1 + -4 + iVar5;
      }
      lVar8 = lVar8 + 4;
      lVar7 = lVar7 + -4;
    } while (-lVar7 != (ulong)(iVar1 + 3U & 0xfffffffc));
  }
  if (n != 0) {
    lVar6 = (long)n;
    do {
      perm[nums[lVar6 + -1]] = -1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x11])(this,perm);
  return;
}

Assistant:

virtual void removeRows(int nums[], int n, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         DataArray < int > p(nRows());
         removeRows(nums, n, p.get_ptr());
         return;
      }

      for(int i = nRows() - 1; i >= 0; --i)
         perm[i] = i;

      while(n--)
         perm[nums[n]] = -1;

      removeRows(perm);
   }